

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

bool __thiscall ValueSerializer::operator()(ValueSerializer *this,FILE *fp,string *value)

{
  int iVar1;
  size_t sVar2;
  void *__ptr;
  bool bVar3;
  int size;
  int local_2c;
  
  sVar2 = fread(&local_2c,4,1,(FILE *)fp);
  if (sVar2 == 1) {
    iVar1 = -1;
    if (-1 < local_2c) {
      iVar1 = local_2c;
    }
    __ptr = operator_new__((long)iVar1);
    sVar2 = fread(__ptr,(long)local_2c,1,(FILE *)fp);
    bVar3 = sVar2 == 1;
    if (bVar3) {
      (value->_M_dataplus)._M_p = (pointer)&value->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)value,__ptr,(long)__ptr + (long)local_2c);
    }
    operator_delete__(__ptr);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator()(FILE* fp, string* value) {
    int size;
    if (!(*this)(fp, &size)) return false;
    char* buf = new char[size];
    if (fread(buf, size, 1, fp) != 1) {
      delete[] buf;
      return false;
    }
    new (value) string(buf, size);
    delete[] buf;
    return true;
  }